

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O2

int ImfHeaderSetBox2iAttribute(ImfHeader *hdr,char *name,int xMin,int yMin,int xMax,int yMax)

{
  Iterator IVar1;
  iterator iVar2;
  TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>_>_> *pTVar3;
  Box2i box;
  TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>_>_> local_48;
  
  box.min.x = xMin;
  box.min.y = yMin;
  box.max.x = xMax;
  box.max.y = yMax;
  IVar1 = Imf_3_4::Header::find((Header *)hdr,name);
  iVar2._M_node = (_Base_ptr)Imf_3_4::Header::end((Header *)hdr);
  if (IVar1._i._M_node == (iterator)iVar2._M_node) {
    Imf_3_4::TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>_>_>::TypedAttribute(&local_48,&box);
    Imf_3_4::Header::insert((Header *)hdr,name,&local_48.super_Attribute);
    Imf_3_4::TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>_>_>::~TypedAttribute(&local_48);
  }
  else {
    pTVar3 = Imf_3_4::Header::
             typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>>>>
                       ((Header *)hdr,name);
    (pTVar3->_value).min.x = xMin;
    (pTVar3->_value).min.y = yMin;
    (pTVar3->_value).max.x = xMax;
    (pTVar3->_value).max.y = yMax;
  }
  return 1;
}

Assistant:

int
ImfHeaderSetBox2iAttribute (
    ImfHeader* hdr, const char name[], int xMin, int yMin, int xMax, int yMax)
{
    try
    {
        Box2i box (V2i (xMin, yMin), V2i (xMax, yMax));

        if (header (hdr)->find (name) == header (hdr)->end ())
        {
            header (hdr)->insert (
                name, OPENEXR_IMF_INTERNAL_NAMESPACE::Box2iAttribute (box));
        }
        else
        {
            header (hdr)
                ->typedAttribute<
                    OPENEXR_IMF_INTERNAL_NAMESPACE::Box2iAttribute> (name)
                .value () = box;
        }

        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}